

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# streams.cpp
# Opt level: O2

int64_t __thiscall AutoFile::tell(AutoFile *this)

{
  long lVar1;
  long lVar2;
  char *pcVar3;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if ((FILE *)this->m_file == (FILE *)0x0) {
    pcVar3 = (char *)__cxa_allocate_exception(0x20);
    std::iostream_category();
    std::ios_base::failure[abi:cxx11]::failure
              (pcVar3,(error_code *)"AutoFile::tell: file handle is nullptr");
  }
  else {
    lVar2 = ftell((FILE *)this->m_file);
    if (-1 < lVar2) {
      if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
        return lVar2;
      }
      goto LAB_0063e4d8;
    }
    pcVar3 = (char *)__cxa_allocate_exception(0x20);
    std::iostream_category();
    std::ios_base::failure[abi:cxx11]::failure(pcVar3,(error_code *)"AutoFile::tell: ftell failed");
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    __cxa_throw(pcVar3,&std::ios_base::failure[abi:cxx11]::typeinfo,
                std::ios_base::failure[abi:cxx11]::~failure);
  }
LAB_0063e4d8:
  __stack_chk_fail();
}

Assistant:

int64_t AutoFile::tell()
{
    if (IsNull()) {
        throw std::ios_base::failure("AutoFile::tell: file handle is nullptr");
    }
    int64_t r{std::ftell(m_file)};
    if (r < 0) {
        throw std::ios_base::failure("AutoFile::tell: ftell failed");
    }
    return r;
}